

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jerror.c
# Opt level: O0

void format_message(j_common_ptr cinfo,char *buffer)

{
  char cVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  char *in_RSI;
  long *in_RDI;
  bool bVar5;
  boolean isstring;
  char ch;
  char *msgptr;
  char *msgtext;
  int msg_code;
  jpeg_error_mgr *err;
  char *local_38;
  char *local_30;
  
  lVar3 = *in_RDI;
  iVar2 = *(int *)(lVar3 + 0x28);
  local_30 = (char *)0x0;
  if ((iVar2 < 1) || (*(int *)(lVar3 + 0x90) < iVar2)) {
    if ((*(long *)(lVar3 + 0x98) != 0) &&
       ((*(int *)(lVar3 + 0xa0) <= iVar2 && (iVar2 <= *(int *)(lVar3 + 0xa4))))) {
      local_30 = *(char **)(*(long *)(lVar3 + 0x98) + (long)(iVar2 - *(int *)(lVar3 + 0xa0)) * 8);
    }
  }
  else {
    local_30 = *(char **)(*(long *)(lVar3 + 0x88) + (long)iVar2 * 8);
  }
  if (local_30 == (char *)0x0) {
    *(int *)(lVar3 + 0x2c) = iVar2;
    local_30 = (char *)**(undefined8 **)(lVar3 + 0x88);
  }
  bVar5 = false;
  local_38 = local_30;
  do {
    pcVar4 = local_38 + 1;
    cVar1 = *local_38;
    if (cVar1 == '\0') goto LAB_0015fceb;
    local_38 = pcVar4;
  } while (cVar1 != '%');
  bVar5 = *pcVar4 == 's';
LAB_0015fceb:
  if (bVar5) {
    sprintf(in_RSI,local_30,lVar3 + 0x2c);
  }
  else {
    sprintf(in_RSI,local_30,(ulong)*(uint *)(lVar3 + 0x2c),(ulong)*(uint *)(lVar3 + 0x30),
            (ulong)*(uint *)(lVar3 + 0x34),(ulong)*(uint *)(lVar3 + 0x38),
            *(undefined4 *)(lVar3 + 0x3c),*(undefined4 *)(lVar3 + 0x40),
            *(undefined4 *)(lVar3 + 0x44),*(undefined4 *)(lVar3 + 0x48));
  }
  return;
}

Assistant:

METHODDEF(void)
format_message(j_common_ptr cinfo, char *buffer)
{
  struct jpeg_error_mgr *err = cinfo->err;
  int msg_code = err->msg_code;
  const char *msgtext = NULL;
  const char *msgptr;
  char ch;
  boolean isstring;

  /* Look up message string in proper table */
  if (msg_code > 0 && msg_code <= err->last_jpeg_message) {
    msgtext = err->jpeg_message_table[msg_code];
  } else if (err->addon_message_table != NULL &&
             msg_code >= err->first_addon_message &&
             msg_code <= err->last_addon_message) {
    msgtext = err->addon_message_table[msg_code - err->first_addon_message];
  }

  /* Defend against bogus message number */
  if (msgtext == NULL) {
    err->msg_parm.i[0] = msg_code;
    msgtext = err->jpeg_message_table[0];
  }

  /* Check for string parameter, as indicated by %s in the message text */
  isstring = FALSE;
  msgptr = msgtext;
  while ((ch = *msgptr++) != '\0') {
    if (ch == '%') {
      if (*msgptr == 's') isstring = TRUE;
      break;
    }
  }

  /* Format the message into the passed buffer */
  if (isstring)
    sprintf(buffer, msgtext, err->msg_parm.s);
  else
    sprintf(buffer, msgtext,
            err->msg_parm.i[0], err->msg_parm.i[1],
            err->msg_parm.i[2], err->msg_parm.i[3],
            err->msg_parm.i[4], err->msg_parm.i[5],
            err->msg_parm.i[6], err->msg_parm.i[7]);
}